

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.hpp
# Opt level: O2

CSVReaderOptions * __thiscall
duckdb::CSVReaderOptions::operator=(CSVReaderOptions *this,CSVReaderOptions *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  unsigned_long uVar3;
  CSVOption<bool> CVar4;
  idx_t iVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  undefined7 uVar9;
  
  DialectOptions::operator=(&this->dialect_options,&param_1->dialect_options);
  CVar4 = param_1->store_rejects;
  this->ignore_errors = param_1->ignore_errors;
  this->store_rejects = CVar4;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&this->rejects_table_name,&param_1->rejects_table_name);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&this->rejects_scan_name,&param_1->rejects_scan_name);
  uVar1 = *(undefined4 *)((long)&param_1->rejects_limit + 4);
  iVar5 = param_1->buffer_sample_size;
  uVar2 = *(undefined4 *)((long)&param_1->buffer_sample_size + 4);
  *(int *)&this->rejects_limit = (int)param_1->rejects_limit;
  *(undefined4 *)((long)&this->rejects_limit + 4) = uVar1;
  *(int *)&this->buffer_sample_size = (int)iVar5;
  *(undefined4 *)((long)&this->buffer_sample_size + 4) = uVar2;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->null_str,&param_1->null_str);
  bVar6 = param_1->allow_quoted_nulls;
  cVar7 = param_1->comment;
  cVar8 = param_1->thousands_separator;
  this->compression = param_1->compression;
  this->allow_quoted_nulls = bVar6;
  this->comment = cVar7;
  this->thousands_separator = cVar8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&this->sql_types_per_column,&(param_1->sql_types_per_column)._M_h);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(this->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &param_1->sql_type_list);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->name_list,&param_1->name_list);
  this->columns_set = param_1->columns_set;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(this->auto_type_candidates).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &param_1->auto_type_candidates);
  ::std::__cxx11::string::operator=
            ((string *)&this->sniffer_user_mismatch_error,
             (string *)&param_1->sniffer_user_mismatch_error);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->was_type_manually_set,
             &(param_1->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>);
  uVar9 = *(undefined7 *)&(param_1->maximum_line_size).field_0x1;
  uVar3 = (param_1->maximum_line_size).value;
  (this->maximum_line_size).set_by_user = (param_1->maximum_line_size).set_by_user;
  *(undefined7 *)&(this->maximum_line_size).field_0x1 = uVar9;
  (this->maximum_line_size).value = uVar3;
  this->normalize_names = param_1->normalize_names;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&this->force_not_null_names,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&param_1->force_not_null_names);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->force_not_null,
             &(param_1->force_not_null).super_vector<bool,_std::allocator<bool>_>);
  this->sample_size_chunks = param_1->sample_size_chunks;
  bVar6 = param_1->auto_detect;
  this->all_varchar = param_1->all_varchar;
  this->auto_detect = bVar6;
  ::std::__cxx11::string::operator=((string *)&this->file_path,(string *)&param_1->file_path);
  uVar9 = *(undefined7 *)&(param_1->buffer_size_option).field_0x1;
  uVar3 = (param_1->buffer_size_option).value;
  (this->buffer_size_option).set_by_user = (param_1->buffer_size_option).set_by_user;
  *(undefined7 *)&(this->buffer_size_option).field_0x1 = uVar9;
  (this->buffer_size_option).value = uVar3;
  ::std::__cxx11::string::operator=
            ((string *)&this->decimal_separator,(string *)&param_1->decimal_separator);
  bVar6 = param_1->parallel;
  this->null_padding = param_1->null_padding;
  this->parallel = bVar6;
  ::std::__cxx11::string::operator=((string *)&this->encoding,(string *)&param_1->encoding);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(this->user_defined_parameters)._M_t,&(param_1->user_defined_parameters)._M_t);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->force_quote,
             &(param_1->force_quote).super_vector<bool,_std::allocator<bool>_>);
  ::std::__cxx11::string::operator=((string *)&this->prefix,(string *)&param_1->prefix);
  ::std::__cxx11::string::operator=((string *)&this->suffix,(string *)&param_1->suffix);
  ::std::__cxx11::string::operator=
            ((string *)&this->write_newline,(string *)&param_1->write_newline);
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::operator=(&(this->write_date_format)._M_t,&(param_1->write_date_format)._M_t);
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_bool>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_bool>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::operator=(&(this->has_format)._M_t,&(param_1->has_format)._M_t);
  this->multi_file_reader = param_1->multi_file_reader;
  return this;
}

Assistant:

CSVReaderOptions() {
	}